

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O3

void operator_delete(void *p,size_t size,align_val_t align)

{
  ThreadCache *this;
  void *pvVar1;
  Span *span;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  long in_FS_OFFSET;
  
  if (base::internal::delete_hooks_ != 0) {
    tcmalloc::invoke_hooks_and_free(p);
    return;
  }
  this = *(ThreadCache **)(in_FS_OFFSET + -8);
  uVar3 = (ulong)p >> 0xd;
  uVar4 = *(ulong *)(tcmalloc::Static::pageheap_ + (uVar3 & 0xffff) * 8 + 0x10) ^
          uVar3 & 0xffffffffffff0000;
  if (0x7f < uVar4) {
    if ((((ulong)p >> 0x30 != 0) ||
        (*(long *)(tcmalloc::Static::pageheap_ + ((ulong)p >> 0x1f) * 8 + 0x80010) == 0)) ||
       (span = *(Span **)(*(long *)(tcmalloc::Static::pageheap_ + ((ulong)p >> 0x1f) * 8 + 0x80010)
                         + (ulong)((uint)uVar3 & 0x3ffff) * 8), span == (Span *)0x0))
    goto LAB_0010df83;
    uVar4 = (ulong)(byte)span->field_0x2a;
    if (uVar4 == 0) {
      anon_unknown.dwarf_16b90::do_free_pages(span,p);
      return;
    }
    *(ulong *)(tcmalloc::Static::pageheap_ + (uVar3 & 0xffff) * 8 + 0x10) =
         uVar3 & 0xffffffffffff0000 | uVar4;
  }
  if (this != (ThreadCache *)0x0) {
    uVar3 = uVar4 & 0xffffffff;
    uVar5 = this->list_[uVar3].length_ + 1;
    pvVar1 = this->list_[uVar3].list_;
    this->list_[uVar3].list_ = p;
    *(void **)p = pvVar1;
    this->list_[uVar3].length_ = uVar5;
    if (this->list_[uVar3].max_length_ < uVar5) {
      tcmalloc::ThreadCache::ListTooLong(this,this->list_ + uVar3,(uint32_t)uVar4);
      return;
    }
    iVar2 = this->size_ + this->list_[uVar3].size_;
    this->size_ = iVar2;
    if (iVar2 <= this->max_size_) {
      return;
    }
    tcmalloc::ThreadCache::Scavenge(this);
    return;
  }
  if (tcmalloc::Static::inited_ != '\0') {
    *(undefined8 *)p = 0;
    tcmalloc::CentralFreeList::InsertRange
              ((CentralFreeList *)(&tcmalloc::Static::central_cache_ + (uVar4 & 0xffffffff) * 0x130)
               ,p,p,1);
    return;
  }
LAB_0010df83:
  if (p == (void *)0x0) {
    return;
  }
  anon_unknown.dwarf_16b90::InvalidFree(p);
  return;
}

Assistant:

PERFTOOLS_DLL_DECL void tc_delete_sized_aligned(void* p, size_t size, std::align_val_t align) PERFTOOLS_NOTHROW
{
  free_fast_path(p);
}